

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::ValidateSymbolName
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  uVar2 = name->_M_string_length;
  bVar4 = uVar2 == 0;
  if (!bVar4) {
    uVar3 = 1;
    do {
      bVar1 = (name->_M_dataplus)._M_p[uVar3 - 1];
      if ((((bVar1 != 0x2e) && (bVar1 != 0x5f)) && ((byte)(bVar1 - 0x3a) < 0xf6)) &&
         ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) {
        return bVar4;
      }
      bVar4 = uVar2 <= uVar3;
      bVar5 = uVar3 != uVar2;
      uVar3 = uVar3 + 1;
    } while (bVar5);
  }
  return bVar4;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::ValidateSymbolName(
    const std::string& name) {
  for (int i = 0; i < name.size(); i++) {
    // I don't trust ctype.h due to locales.  :(
    if (name[i] != '.' && name[i] != '_' && (name[i] < '0' || name[i] > '9') &&
        (name[i] < 'A' || name[i] > 'Z') && (name[i] < 'a' || name[i] > 'z')) {
      return false;
    }
  }
  return true;
}